

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O3

int Bac_ManClpObjNum(Bac_Man_t *p)

{
  int iVar1;
  Bac_Ntk_t *pBVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int *piVar7;
  long lVar8;
  int *piVar9;
  ulong uVar10;
  Bac_Ntk_t *p_00;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  auVar5 = _DAT_009134e0;
  auVar4 = _DAT_00912220;
  auVar3 = _DAT_00912210;
  iVar1 = p->nNtks;
  if (0 < (long)iVar1) {
    lVar8 = (long)iVar1 + -1;
    auVar11._8_4_ = (int)lVar8;
    auVar11._0_8_ = lVar8;
    auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
    piVar7 = &p->pNtks[1].Count;
    uVar10 = 0;
    auVar11 = auVar11 ^ _DAT_00912220;
    do {
      auVar13._8_4_ = (int)uVar10;
      auVar13._0_8_ = uVar10;
      auVar13._12_4_ = (int)(uVar10 >> 0x20);
      auVar14 = (auVar13 | auVar3) ^ auVar4;
      iVar12 = auVar11._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar12 && auVar11._0_4_ < auVar14._0_4_ ||
                  iVar12 < auVar14._4_4_) & 1)) {
        *piVar7 = -1;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        piVar7[0x34] = 0xffffffff;
      }
      auVar13 = (auVar13 | auVar5) ^ auVar4;
      iVar6 = auVar13._4_4_;
      if (iVar6 <= iVar12 && (iVar6 != iVar12 || auVar13._0_4_ <= auVar11._0_4_)) {
        piVar7[0x68] = 0xffffffff;
        piVar7[0x9c] = 0xffffffff;
      }
      uVar10 = uVar10 + 4;
      piVar7 = piVar7 + 0xd0;
    } while ((iVar1 + 3U & 0xfffffffc) != uVar10);
  }
  lVar8 = (long)p->iRoot;
  if (lVar8 < 1) {
    p_00 = (Bac_Ntk_t *)0x0;
    piVar7 = (int *)&DAT_00000024;
    piVar9 = (int *)&DAT_00000034;
  }
  else {
    pBVar2 = p->pNtks;
    p_00 = pBVar2 + lVar8;
    piVar7 = &pBVar2[lVar8].vOutputs.nSize;
    piVar9 = &pBVar2[lVar8].vInputs.nSize;
  }
  iVar1 = *piVar9;
  iVar12 = *piVar7;
  iVar6 = Bac_ManClpObjNum_rec(p_00);
  return iVar6 + iVar1 + iVar12;
}

Assistant:

int Bac_ManClpObjNum( Bac_Man_t * p )
{
    Bac_Ntk_t * pNtk; int i;
    Bac_ManForEachNtk( p, pNtk, i )
        pNtk->Count = -1;
    return Bac_NtkPioNum( Bac_ManRoot(p) ) + Bac_ManClpObjNum_rec( Bac_ManRoot(p) );
}